

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::populate_initial_block_list
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this,size_t blockCount)

{
  atomic<bool> *paVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Block *pBVar26;
  bool *pbVar27;
  ulong uVar28;
  long lVar29;
  int iVar40;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  long lVar41;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar63;
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar78;
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  long lVar44;
  
  this->initialBlockPoolSize = blockCount;
  if (blockCount == 0) {
    this->initialBlockPool = (Block *)0x0;
  }
  else {
    pBVar26 = (Block *)malloc(blockCount * 0x148);
    if (pBVar26 == (Block *)0x0) {
      pBVar26 = (Block *)0x0;
    }
    else {
      pbVar27 = &pBVar26->dynamicallyAllocated;
      do {
        (((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
           *)(pbVar27 + -8))->_M_b)._M_p = (__pointer_type)0x0;
        *(undefined1 (*) [16])(pbVar27 + -0x40) = (undefined1  [16])0x0;
        paVar1 = (atomic<bool> *)(pbVar27 + -0x30);
        paVar1->_M_base = (__atomic_base<bool>)0x0;
        paVar1[1] = (__atomic_base<bool>)0x0;
        paVar1[2] = (__atomic_base<bool>)0x0;
        paVar1[3] = (__atomic_base<bool>)0x0;
        paVar1[4] = (__atomic_base<bool>)0x0;
        paVar1[5] = (__atomic_base<bool>)0x0;
        paVar1[6] = (__atomic_base<bool>)0x0;
        paVar1[7] = (__atomic_base<bool>)0x0;
        paVar1[8] = (__atomic_base<bool>)0x0;
        paVar1[9] = (__atomic_base<bool>)0x0;
        paVar1[10] = (__atomic_base<bool>)0x0;
        paVar1[0xb] = (__atomic_base<bool>)0x0;
        paVar1[0xc] = (__atomic_base<bool>)0x0;
        paVar1[0xd] = (__atomic_base<bool>)0x0;
        paVar1[0xe] = (__atomic_base<bool>)0x0;
        paVar1[0xf] = (__atomic_base<bool>)0x0;
        paVar1 = (atomic<bool> *)(pbVar27 + -0x20);
        paVar1->_M_base = (__atomic_base<bool>)0x0;
        paVar1[1] = (__atomic_base<bool>)0x0;
        paVar1[2] = (__atomic_base<bool>)0x0;
        paVar1[3] = (__atomic_base<bool>)0x0;
        paVar1[4] = (__atomic_base<bool>)0x0;
        paVar1[5] = (__atomic_base<bool>)0x0;
        paVar1[6] = (__atomic_base<bool>)0x0;
        paVar1[7] = (__atomic_base<bool>)0x0;
        paVar1[8] = (__atomic_base<bool>)0x0;
        paVar1[9] = (__atomic_base<bool>)0x0;
        paVar1[10] = (__atomic_base<bool>)0x0;
        paVar1[0xb] = (__atomic_base<bool>)0x0;
        paVar1[0xc] = (__atomic_base<bool>)0x0;
        paVar1[0xd] = (__atomic_base<bool>)0x0;
        paVar1[0xe] = (__atomic_base<bool>)0x0;
        paVar1[0xf] = (__atomic_base<bool>)0x0;
        (((atomic<unsigned_int> *)(pbVar27 + -0x10))->super___atomic_base<unsigned_int>)._M_i = 0;
        *pbVar27 = true;
        pbVar27 = pbVar27 + 0x148;
        blockCount = blockCount - 1;
      } while (blockCount != 0);
    }
    this->initialBlockPool = pBVar26;
    if (pBVar26 == (Block *)0x0) {
      this->initialBlockPoolSize = 0;
    }
    auVar25 = _DAT_002ce100;
    sVar2 = this->initialBlockPoolSize;
    if (sVar2 != 0) {
      uVar28 = sVar2 + 0xf & 0xfffffffffffffff0;
      lVar29 = sVar2 - 1;
      auVar30._8_4_ = (int)lVar29;
      auVar30._0_8_ = lVar29;
      auVar30._12_4_ = (int)((ulong)lVar29 >> 0x20);
      pbVar27 = &pBVar26[0xf].dynamicallyAllocated;
      auVar31 = auVar30;
      auVar43 = _DAT_002ce080;
      auVar45 = _DAT_002ce090;
      auVar46 = _DAT_002ce0a0;
      auVar47 = _DAT_002ce0b0;
      auVar48 = _DAT_002ce0c0;
      auVar49 = _DAT_002ce0d0;
      auVar50 = _DAT_002ce0e0;
      auVar51 = _DAT_002ce0f0;
      do {
        auVar61 = auVar30 ^ auVar25;
        auVar65 = auVar51 ^ auVar25;
        iVar40 = auVar61._0_4_;
        iVar78 = -(uint)(iVar40 < auVar65._0_4_);
        iVar42 = auVar61._4_4_;
        auVar67._4_4_ = -(uint)(iVar42 < auVar65._4_4_);
        iVar63 = auVar61._8_4_;
        iVar82 = -(uint)(iVar63 < auVar65._8_4_);
        iVar64 = auVar61._12_4_;
        auVar67._12_4_ = -(uint)(iVar64 < auVar65._12_4_);
        auVar61._4_4_ = iVar78;
        auVar61._0_4_ = iVar78;
        auVar61._8_4_ = iVar82;
        auVar61._12_4_ = iVar82;
        auVar61 = pshuflw(auVar31,auVar61,0xe8);
        auVar66._4_4_ = -(uint)(auVar65._4_4_ == iVar42);
        auVar66._12_4_ = -(uint)(auVar65._12_4_ == iVar64);
        auVar66._0_4_ = auVar66._4_4_;
        auVar66._8_4_ = auVar66._12_4_;
        auVar52 = pshuflw(in_XMM11,auVar66,0xe8);
        auVar67._0_4_ = auVar67._4_4_;
        auVar67._8_4_ = auVar67._12_4_;
        auVar65 = pshuflw(auVar61,auVar67,0xe8);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = (auVar65 | auVar52 & auVar61) ^ auVar31;
        auVar31 = packssdw(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar27[-0x1338] = false;
        }
        auVar52._4_4_ = iVar78;
        auVar52._0_4_ = iVar78;
        auVar52._8_4_ = iVar82;
        auVar52._12_4_ = iVar82;
        auVar67 = auVar66 & auVar52 | auVar67;
        auVar31 = packssdw(auVar67,auVar67);
        auVar65._8_4_ = 0xffffffff;
        auVar65._0_8_ = 0xffffffffffffffff;
        auVar65._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar65,auVar31 ^ auVar65);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 8 & 1) != 0) {
          pbVar27[-0x11f0] = false;
        }
        auVar31 = auVar50 ^ auVar25;
        auVar53._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar53._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar53._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar53._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar68._4_4_ = auVar53._0_4_;
        auVar68._0_4_ = auVar53._0_4_;
        auVar68._8_4_ = auVar53._8_4_;
        auVar68._12_4_ = auVar53._8_4_;
        iVar78 = -(uint)(auVar31._4_4_ == iVar42);
        iVar82 = -(uint)(auVar31._12_4_ == iVar64);
        auVar12._4_4_ = iVar78;
        auVar12._0_4_ = iVar78;
        auVar12._8_4_ = iVar82;
        auVar12._12_4_ = iVar82;
        auVar79._4_4_ = auVar53._4_4_;
        auVar79._0_4_ = auVar53._4_4_;
        auVar79._8_4_ = auVar53._12_4_;
        auVar79._12_4_ = auVar53._12_4_;
        auVar31 = auVar12 & auVar68 | auVar79;
        auVar31 = packssdw(auVar31,auVar31);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar3,auVar31 ^ auVar3);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 0x10 & 1) != 0) {
          pbVar27[-0x10a8] = false;
        }
        auVar31 = pshufhw(auVar31,auVar68,0x84);
        auVar13._4_4_ = iVar78;
        auVar13._0_4_ = iVar78;
        auVar13._8_4_ = iVar82;
        auVar13._12_4_ = iVar82;
        auVar65 = pshufhw(auVar53,auVar13,0x84);
        auVar61 = pshufhw(auVar31,auVar79,0x84);
        auVar32._8_4_ = 0xffffffff;
        auVar32._0_8_ = 0xffffffffffffffff;
        auVar32._12_4_ = 0xffffffff;
        auVar32 = (auVar61 | auVar65 & auVar31) ^ auVar32;
        auVar31 = packssdw(auVar32,auVar32);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._0_4_ >> 0x18 & 1) != 0) {
          pbVar27[-0xf60] = false;
        }
        auVar31 = auVar49 ^ auVar25;
        auVar54._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar54._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar54._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar54._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar14._4_4_ = auVar54._0_4_;
        auVar14._0_4_ = auVar54._0_4_;
        auVar14._8_4_ = auVar54._8_4_;
        auVar14._12_4_ = auVar54._8_4_;
        auVar65 = pshuflw(auVar79,auVar14,0xe8);
        auVar33._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
        auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
        auVar33._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
        auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
        auVar69._4_4_ = auVar33._4_4_;
        auVar69._0_4_ = auVar33._4_4_;
        auVar69._8_4_ = auVar33._12_4_;
        auVar69._12_4_ = auVar33._12_4_;
        auVar31 = pshuflw(auVar33,auVar69,0xe8);
        auVar70._4_4_ = auVar54._4_4_;
        auVar70._0_4_ = auVar54._4_4_;
        auVar70._8_4_ = auVar54._12_4_;
        auVar70._12_4_ = auVar54._12_4_;
        auVar61 = pshuflw(auVar54,auVar70,0xe8);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar4);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar27[-0xe18] = false;
        }
        auVar15._4_4_ = auVar54._0_4_;
        auVar15._0_4_ = auVar54._0_4_;
        auVar15._8_4_ = auVar54._8_4_;
        auVar15._12_4_ = auVar54._8_4_;
        auVar70 = auVar69 & auVar15 | auVar70;
        auVar61 = packssdw(auVar70,auVar70);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31,auVar61 ^ auVar5);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._4_2_ >> 8 & 1) != 0) {
          pbVar27[-0xcd0] = false;
        }
        auVar31 = auVar48 ^ auVar25;
        auVar55._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar55._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar55._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar55._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar71._4_4_ = auVar55._0_4_;
        auVar71._0_4_ = auVar55._0_4_;
        auVar71._8_4_ = auVar55._8_4_;
        auVar71._12_4_ = auVar55._8_4_;
        iVar78 = -(uint)(auVar31._4_4_ == iVar42);
        iVar82 = -(uint)(auVar31._12_4_ == iVar64);
        auVar16._4_4_ = iVar78;
        auVar16._0_4_ = iVar78;
        auVar16._8_4_ = iVar82;
        auVar16._12_4_ = iVar82;
        auVar80._4_4_ = auVar55._4_4_;
        auVar80._0_4_ = auVar55._4_4_;
        auVar80._8_4_ = auVar55._12_4_;
        auVar80._12_4_ = auVar55._12_4_;
        auVar31 = auVar16 & auVar71 | auVar80;
        auVar31 = packssdw(auVar31,auVar31);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar6,auVar31 ^ auVar6);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar27[-0xb88] = false;
        }
        auVar31 = pshufhw(auVar31,auVar71,0x84);
        auVar17._4_4_ = iVar78;
        auVar17._0_4_ = iVar78;
        auVar17._8_4_ = iVar82;
        auVar17._12_4_ = iVar82;
        auVar65 = pshufhw(auVar55,auVar17,0x84);
        auVar61 = pshufhw(auVar31,auVar80,0x84);
        auVar34._8_4_ = 0xffffffff;
        auVar34._0_8_ = 0xffffffffffffffff;
        auVar34._12_4_ = 0xffffffff;
        auVar34 = (auVar61 | auVar65 & auVar31) ^ auVar34;
        auVar31 = packssdw(auVar34,auVar34);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._6_2_ >> 8 & 1) != 0) {
          pbVar27[-0xa40] = false;
        }
        auVar31 = auVar47 ^ auVar25;
        auVar56._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar56._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar56._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar56._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar18._4_4_ = auVar56._0_4_;
        auVar18._0_4_ = auVar56._0_4_;
        auVar18._8_4_ = auVar56._8_4_;
        auVar18._12_4_ = auVar56._8_4_;
        auVar65 = pshuflw(auVar80,auVar18,0xe8);
        auVar35._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
        auVar35._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
        auVar35._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
        auVar35._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
        auVar72._4_4_ = auVar35._4_4_;
        auVar72._0_4_ = auVar35._4_4_;
        auVar72._8_4_ = auVar35._12_4_;
        auVar72._12_4_ = auVar35._12_4_;
        auVar31 = pshuflw(auVar35,auVar72,0xe8);
        auVar73._4_4_ = auVar56._4_4_;
        auVar73._0_4_ = auVar56._4_4_;
        auVar73._8_4_ = auVar56._12_4_;
        auVar73._12_4_ = auVar56._12_4_;
        auVar61 = pshuflw(auVar56,auVar73,0xe8);
        auVar57._8_4_ = 0xffffffff;
        auVar57._0_8_ = 0xffffffffffffffff;
        auVar57._12_4_ = 0xffffffff;
        auVar57 = (auVar61 | auVar31 & auVar65) ^ auVar57;
        auVar61 = packssdw(auVar57,auVar57);
        auVar31 = packsswb(auVar31 & auVar65,auVar61);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar27[-0x8f8] = false;
        }
        auVar19._4_4_ = auVar56._0_4_;
        auVar19._0_4_ = auVar56._0_4_;
        auVar19._8_4_ = auVar56._8_4_;
        auVar19._12_4_ = auVar56._8_4_;
        auVar73 = auVar72 & auVar19 | auVar73;
        auVar61 = packssdw(auVar73,auVar73);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar61 = packssdw(auVar61 ^ auVar7,auVar61 ^ auVar7);
        auVar31 = packsswb(auVar31,auVar61);
        if ((auVar31._8_2_ >> 8 & 1) != 0) {
          pbVar27[-0x7b0] = false;
        }
        auVar31 = auVar46 ^ auVar25;
        auVar58._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar58._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar58._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar58._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar74._4_4_ = auVar58._0_4_;
        auVar74._0_4_ = auVar58._0_4_;
        auVar74._8_4_ = auVar58._8_4_;
        auVar74._12_4_ = auVar58._8_4_;
        iVar78 = -(uint)(auVar31._4_4_ == iVar42);
        iVar82 = -(uint)(auVar31._12_4_ == iVar64);
        auVar20._4_4_ = iVar78;
        auVar20._0_4_ = iVar78;
        auVar20._8_4_ = iVar82;
        auVar20._12_4_ = iVar82;
        auVar81._4_4_ = auVar58._4_4_;
        auVar81._0_4_ = auVar58._4_4_;
        auVar81._8_4_ = auVar58._12_4_;
        auVar81._12_4_ = auVar58._12_4_;
        auVar31 = auVar20 & auVar74 | auVar81;
        auVar31 = packssdw(auVar31,auVar31);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar8,auVar31 ^ auVar8);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar27[-0x668] = false;
        }
        auVar31 = pshufhw(auVar31,auVar74,0x84);
        auVar21._4_4_ = iVar78;
        auVar21._0_4_ = iVar78;
        auVar21._8_4_ = iVar82;
        auVar21._12_4_ = iVar82;
        auVar65 = pshufhw(auVar58,auVar21,0x84);
        auVar61 = pshufhw(auVar31,auVar81,0x84);
        auVar36._8_4_ = 0xffffffff;
        auVar36._0_8_ = 0xffffffffffffffff;
        auVar36._12_4_ = 0xffffffff;
        auVar36 = (auVar61 | auVar65 & auVar31) ^ auVar36;
        auVar31 = packssdw(auVar36,auVar36);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._10_2_ >> 8 & 1) != 0) {
          pbVar27[-0x520] = false;
        }
        auVar31 = auVar45 ^ auVar25;
        auVar59._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar59._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar59._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar59._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar22._4_4_ = auVar59._0_4_;
        auVar22._0_4_ = auVar59._0_4_;
        auVar22._8_4_ = auVar59._8_4_;
        auVar22._12_4_ = auVar59._8_4_;
        auVar65 = pshuflw(auVar81,auVar22,0xe8);
        auVar37._0_4_ = -(uint)(auVar31._0_4_ == iVar40);
        auVar37._4_4_ = -(uint)(auVar31._4_4_ == iVar42);
        auVar37._8_4_ = -(uint)(auVar31._8_4_ == iVar63);
        auVar37._12_4_ = -(uint)(auVar31._12_4_ == iVar64);
        auVar75._4_4_ = auVar37._4_4_;
        auVar75._0_4_ = auVar37._4_4_;
        auVar75._8_4_ = auVar37._12_4_;
        auVar75._12_4_ = auVar37._12_4_;
        auVar31 = pshuflw(auVar37,auVar75,0xe8);
        auVar76._4_4_ = auVar59._4_4_;
        auVar76._0_4_ = auVar59._4_4_;
        auVar76._8_4_ = auVar59._12_4_;
        auVar76._12_4_ = auVar59._12_4_;
        auVar61 = pshuflw(auVar59,auVar76,0xe8);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 & auVar65,(auVar61 | auVar31 & auVar65) ^ auVar9);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar27[-0x3d8] = false;
        }
        auVar23._4_4_ = auVar59._0_4_;
        auVar23._0_4_ = auVar59._0_4_;
        auVar23._8_4_ = auVar59._8_4_;
        auVar23._12_4_ = auVar59._8_4_;
        auVar76 = auVar75 & auVar23 | auVar76;
        auVar61 = packssdw(auVar76,auVar76);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31,auVar61 ^ auVar10);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._12_2_ >> 8 & 1) != 0) {
          pbVar27[-0x290] = false;
        }
        auVar31 = auVar43 ^ auVar25;
        auVar60._0_4_ = -(uint)(iVar40 < auVar31._0_4_);
        auVar60._4_4_ = -(uint)(iVar42 < auVar31._4_4_);
        auVar60._8_4_ = -(uint)(iVar63 < auVar31._8_4_);
        auVar60._12_4_ = -(uint)(iVar64 < auVar31._12_4_);
        auVar77._4_4_ = auVar60._0_4_;
        auVar77._0_4_ = auVar60._0_4_;
        auVar77._8_4_ = auVar60._8_4_;
        auVar77._12_4_ = auVar60._8_4_;
        iVar40 = -(uint)(auVar31._4_4_ == iVar42);
        iVar42 = -(uint)(auVar31._12_4_ == iVar64);
        auVar62._4_4_ = iVar40;
        auVar62._0_4_ = iVar40;
        auVar62._8_4_ = iVar42;
        auVar62._12_4_ = iVar42;
        auVar38._4_4_ = auVar60._4_4_;
        auVar38._0_4_ = auVar60._4_4_;
        auVar38._8_4_ = auVar60._12_4_;
        auVar38._12_4_ = auVar60._12_4_;
        auVar38 = auVar62 & auVar77 | auVar38;
        auVar31 = packssdw(auVar38,auVar38);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar11,auVar31 ^ auVar11);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar27[-0x148] = false;
        }
        auVar31 = pshufhw(auVar31,auVar77,0x84);
        in_XMM11 = pshufhw(auVar60,auVar62,0x84);
        in_XMM11 = in_XMM11 & auVar31;
        auVar24._4_4_ = auVar60._4_4_;
        auVar24._0_4_ = auVar60._4_4_;
        auVar24._8_4_ = auVar60._12_4_;
        auVar24._12_4_ = auVar60._12_4_;
        auVar31 = pshufhw(auVar31,auVar24,0x84);
        auVar39._8_4_ = 0xffffffff;
        auVar39._0_8_ = 0xffffffffffffffff;
        auVar39._12_4_ = 0xffffffff;
        auVar39 = (auVar31 | in_XMM11) ^ auVar39;
        auVar31 = packssdw(auVar39,auVar39);
        auVar31 = packsswb(auVar31,auVar31);
        if ((auVar31._14_2_ >> 8 & 1) != 0) {
          *pbVar27 = false;
        }
        lVar29 = (long)DAT_002ce110;
        lVar44 = auVar51._8_8_;
        auVar51._0_8_ = auVar51._0_8_ + lVar29;
        lVar41 = DAT_002ce110._8_8_;
        auVar51._8_8_ = lVar44 + lVar41;
        lVar44 = auVar50._8_8_;
        auVar50._0_8_ = auVar50._0_8_ + lVar29;
        auVar50._8_8_ = lVar44 + lVar41;
        lVar44 = auVar49._8_8_;
        auVar49._0_8_ = auVar49._0_8_ + lVar29;
        auVar49._8_8_ = lVar44 + lVar41;
        lVar44 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + lVar29;
        auVar48._8_8_ = lVar44 + lVar41;
        lVar44 = auVar47._8_8_;
        auVar47._0_8_ = auVar47._0_8_ + lVar29;
        auVar47._8_8_ = lVar44 + lVar41;
        lVar44 = auVar46._8_8_;
        auVar46._0_8_ = auVar46._0_8_ + lVar29;
        auVar46._8_8_ = lVar44 + lVar41;
        lVar44 = auVar45._8_8_;
        auVar45._0_8_ = auVar45._0_8_ + lVar29;
        auVar45._8_8_ = lVar44 + lVar41;
        lVar44 = auVar43._8_8_;
        auVar43._0_8_ = auVar43._0_8_ + lVar29;
        auVar43._8_8_ = lVar44 + lVar41;
        pbVar27 = pbVar27 + 0x1480;
        uVar28 = uVar28 - 0x10;
        auVar31 = _DAT_002ce110;
      } while (uVar28 != 0);
    }
  }
  return;
}

Assistant:

void populate_initial_block_list(size_t blockCount) {
    initialBlockPoolSize = blockCount;
    if (initialBlockPoolSize == 0) {
      initialBlockPool = nullptr;
      return;
    }

    initialBlockPool = create_array<Block>(blockCount);
    if (initialBlockPool == nullptr) {
      initialBlockPoolSize = 0;
    }
    for (size_t i = 0; i < initialBlockPoolSize; ++i) {
      initialBlockPool[i].dynamicallyAllocated = false;
    }
  }